

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O1

void WebRtcIsac_InitPreFilterbank(PreFiltBankstr *prefiltdata)

{
  memset(prefiltdata->INLABUF1,0,0x180);
  memset(prefiltdata->INLABUF1_float,0,0xc0);
  prefiltdata->INSTAT1[0] = 0.0;
  prefiltdata->INSTAT1[1] = 0.0;
  prefiltdata->INSTAT1[2] = 0.0;
  prefiltdata->INSTAT1[3] = 0.0;
  prefiltdata->INSTAT2[0] = 0.0;
  prefiltdata->INSTAT2[1] = 0.0;
  prefiltdata->INSTAT2[2] = 0.0;
  prefiltdata->INSTAT2[3] = 0.0;
  prefiltdata->INSTATLA1[0] = 0.0;
  prefiltdata->INSTATLA1[1] = 0.0;
  prefiltdata->INSTATLA1[2] = 0.0;
  prefiltdata->INSTATLA1[3] = 0.0;
  prefiltdata->INSTATLA2[0] = 0.0;
  prefiltdata->INSTATLA2[1] = 0.0;
  prefiltdata->INSTATLA2[2] = 0.0;
  prefiltdata->INSTATLA2[3] = 0.0;
  prefiltdata->INSTAT1_float[0] = 0.0;
  prefiltdata->INSTAT1_float[1] = 0.0;
  prefiltdata->INSTAT1_float[2] = 0.0;
  prefiltdata->INSTAT1_float[3] = 0.0;
  prefiltdata->INSTAT2_float[0] = 0.0;
  prefiltdata->INSTAT2_float[1] = 0.0;
  prefiltdata->INSTAT2_float[2] = 0.0;
  prefiltdata->INSTAT2_float[3] = 0.0;
  prefiltdata->INSTATLA1_float[0] = 0.0;
  prefiltdata->INSTATLA1_float[1] = 0.0;
  prefiltdata->INSTATLA1_float[2] = 0.0;
  prefiltdata->INSTATLA1_float[3] = 0.0;
  prefiltdata->INSTATLA2_float[0] = 0.0;
  prefiltdata->INSTATLA2_float[1] = 0.0;
  prefiltdata->INSTATLA2_float[2] = 0.0;
  prefiltdata->INSTATLA2_float[3] = 0.0;
  prefiltdata->HPstates[0] = 0.0;
  prefiltdata->HPstates[1] = 0.0;
  prefiltdata->HPstates_float[0] = 0.0;
  prefiltdata->HPstates_float[1] = 0.0;
  return;
}

Assistant:

void WebRtcIsac_InitPreFilterbank(PreFiltBankstr *prefiltdata)
{
  int k;

  for (k = 0; k < QLOOKAHEAD; k++) {
    prefiltdata->INLABUF1[k] = 0;
    prefiltdata->INLABUF2[k] = 0;

    prefiltdata->INLABUF1_float[k] = 0;
    prefiltdata->INLABUF2_float[k] = 0;
  }
  for (k = 0; k < 2*(QORDER-1); k++) {
    prefiltdata->INSTAT1[k] = 0;
    prefiltdata->INSTAT2[k] = 0;
    prefiltdata->INSTATLA1[k] = 0;
    prefiltdata->INSTATLA2[k] = 0;

    prefiltdata->INSTAT1_float[k] = 0;
    prefiltdata->INSTAT2_float[k] = 0;
    prefiltdata->INSTATLA1_float[k] = 0;
    prefiltdata->INSTATLA2_float[k] = 0;
  }

  /* High pass filter states */
  prefiltdata->HPstates[0] = 0.0;
  prefiltdata->HPstates[1] = 0.0;

  prefiltdata->HPstates_float[0] = 0.0f;
  prefiltdata->HPstates_float[1] = 0.0f;

  return;
}